

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t ZSTD_compressBlock_fast
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  long in_RDI;
  U32 mls;
  size_t in_stack_00000040;
  void *in_stack_00000048;
  U32 *in_stack_00000050;
  seqStore_t *in_stack_00000058;
  ZSTD_matchState_t *in_stack_00000060;
  size_t local_8;
  
  if (*(long *)(in_RDI + 0xf8) == 0) {
    if (*(uint *)(in_RDI + 0x114) < 2) {
      switch(*(undefined4 *)(in_RDI + 0x110)) {
      default:
        local_8 = ZSTD_compressBlock_fast_noDict_4_0
                            (in_stack_00000060,in_stack_00000058,in_stack_00000050,in_stack_00000048
                             ,in_stack_00000040);
        break;
      case 5:
        local_8 = ZSTD_compressBlock_fast_noDict_5_0
                            (in_stack_00000060,in_stack_00000058,in_stack_00000050,in_stack_00000048
                             ,in_stack_00000040);
        break;
      case 6:
        local_8 = ZSTD_compressBlock_fast_noDict_6_0
                            (in_stack_00000060,in_stack_00000058,in_stack_00000050,in_stack_00000048
                             ,in_stack_00000040);
        break;
      case 7:
        local_8 = ZSTD_compressBlock_fast_noDict_7_0
                            (in_stack_00000060,in_stack_00000058,in_stack_00000050,in_stack_00000048
                             ,in_stack_00000040);
      }
    }
    else {
      switch(*(undefined4 *)(in_RDI + 0x110)) {
      default:
        local_8 = ZSTD_compressBlock_fast_noDict_4_1
                            (in_stack_00000060,in_stack_00000058,in_stack_00000050,in_stack_00000048
                             ,in_stack_00000040);
        break;
      case 5:
        local_8 = ZSTD_compressBlock_fast_noDict_5_1
                            (in_stack_00000060,in_stack_00000058,in_stack_00000050,in_stack_00000048
                             ,in_stack_00000040);
        break;
      case 6:
        local_8 = ZSTD_compressBlock_fast_noDict_6_1
                            (in_stack_00000060,in_stack_00000058,in_stack_00000050,in_stack_00000048
                             ,in_stack_00000040);
        break;
      case 7:
        local_8 = ZSTD_compressBlock_fast_noDict_7_1
                            (in_stack_00000060,in_stack_00000058,in_stack_00000050,in_stack_00000048
                             ,in_stack_00000040);
      }
    }
    return local_8;
  }
  __assert_fail("ms->dictMatchState == NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                ,0x715d,
                "size_t ZSTD_compressBlock_fast(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t)"
               );
}

Assistant:

size_t ZSTD_compressBlock_fast(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    U32 const mls = ms->cParams.minMatch;
    assert(ms->dictMatchState == NULL);
    if (ms->cParams.targetLength > 1) {
        switch(mls)
        {
        default: /* includes case 3 */
        case 4 :
            return ZSTD_compressBlock_fast_noDict_4_1(ms, seqStore, rep, src, srcSize);
        case 5 :
            return ZSTD_compressBlock_fast_noDict_5_1(ms, seqStore, rep, src, srcSize);
        case 6 :
            return ZSTD_compressBlock_fast_noDict_6_1(ms, seqStore, rep, src, srcSize);
        case 7 :
            return ZSTD_compressBlock_fast_noDict_7_1(ms, seqStore, rep, src, srcSize);
        }
    } else {
        switch(mls)
        {
        default: /* includes case 3 */
        case 4 :
            return ZSTD_compressBlock_fast_noDict_4_0(ms, seqStore, rep, src, srcSize);
        case 5 :
            return ZSTD_compressBlock_fast_noDict_5_0(ms, seqStore, rep, src, srcSize);
        case 6 :
            return ZSTD_compressBlock_fast_noDict_6_0(ms, seqStore, rep, src, srcSize);
        case 7 :
            return ZSTD_compressBlock_fast_noDict_7_0(ms, seqStore, rep, src, srcSize);
        }

    }
}